

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zpivotL.c
# Opt level: O0

int zpivotL(int jcol,double u,int *usepr,int *perm_r,int *iperm_r,int *iperm_c,int *pivrow,
           GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int_t iVar5;
  flops_t *pfVar6;
  int_t *piVar7;
  void *pvVar8;
  int iVar9;
  int iVar10;
  undefined8 *puVar11;
  undefined8 *puVar12;
  double dVar13;
  double ci;
  double cr;
  flops_t *ops;
  int_t *xlusup;
  doublecomplex *lusup;
  int_t *xlsub;
  int_t *lsub;
  int_t itemp;
  int_t k;
  int_t icol;
  int_t isub;
  int_t *lsub_ptr;
  doublecomplex *lu_col_ptr;
  doublecomplex *lu_sup_ptr;
  doublecomplex temp;
  double thresh;
  double rtemp;
  double pivmax;
  int diagind;
  int diag;
  int old_pivptr;
  int pivptr;
  int_t lptr;
  int nsupr;
  int nsupc;
  int fsupc;
  doublecomplex one;
  int *pivrow_local;
  int *iperm_c_local;
  int *iperm_r_local;
  int *perm_r_local;
  int *usepr_local;
  double u_local;
  int jcol_local;
  
  _nsupc = 1.0;
  one.r = 0.0;
  pfVar6 = stat->ops;
  piVar7 = Glu->lsub;
  pvVar8 = Glu->lusup;
  iVar2 = Glu->xsup[Glu->supno[jcol]];
  lsub._4_4_ = jcol - iVar2;
  iVar10 = Glu->xlsub[iVar2];
  iVar9 = Glu->xlsub[iVar2 + 1] - iVar10;
  iVar2 = Glu->xlusup[iVar2];
  iVar3 = Glu->xlusup[jcol];
  if (*usepr != 0) {
    *pivrow = iperm_r[jcol];
  }
  iVar4 = iperm_c[jcol];
  rtemp = 0.0;
  pivmax._4_4_ = -1;
  diagind = lsub._4_4_;
  diag = lsub._4_4_;
  one.i = (double)pivrow;
  for (k = lsub._4_4_; k < iVar9; k = k + 1) {
    dVar13 = z_abs1((doublecomplex *)((long)pvVar8 + (long)k * 0x10 + (long)iVar3 * 0x10));
    if (rtemp < dVar13) {
      diag = k;
      rtemp = dVar13;
    }
    if ((*usepr != 0) && (piVar7[(long)iVar10 + (long)k] == *(int *)one.i)) {
      diagind = k;
    }
    if (piVar7[(long)iVar10 + (long)k] == iVar4) {
      pivmax._4_4_ = k;
    }
  }
  if ((rtemp != 0.0) || (NAN(rtemp))) {
    temp.i = u * rtemp;
    if (*usepr != 0) {
      dVar13 = z_abs1((doublecomplex *)((long)pvVar8 + (long)diagind * 0x10 + (long)iVar3 * 0x10));
      if (((dVar13 == 0.0) && (!NAN(dVar13))) || (dVar13 < temp.i)) {
        *usepr = 0;
      }
      else {
        diag = diagind;
      }
    }
    if (*usepr == 0) {
      if (-1 < pivmax._4_4_) {
        dVar13 = z_abs1((doublecomplex *)
                        ((long)pvVar8 + (long)pivmax._4_4_ * 0x10 + (long)iVar3 * 0x10));
        if (((dVar13 != 0.0) || (NAN(dVar13))) && (temp.i <= dVar13)) {
          diag = pivmax._4_4_;
        }
      }
      *(int_t *)one.i = piVar7[(long)iVar10 + (long)diag];
    }
    perm_r[*(int *)one.i] = jcol;
    if (diag != lsub._4_4_) {
      iVar5 = piVar7[(long)iVar10 + (long)diag];
      piVar7[(long)iVar10 + (long)diag] = piVar7[(long)iVar10 + (long)lsub._4_4_];
      piVar7[(long)iVar10 + (long)lsub._4_4_] = iVar5;
      for (itemp = 0; itemp <= lsub._4_4_; itemp = itemp + 1) {
        iVar10 = diag + itemp * iVar9;
        puVar11 = (undefined8 *)((long)pvVar8 + (long)iVar10 * 0x10 + (long)iVar2 * 0x10);
        lu_sup_ptr = (doublecomplex *)*puVar11;
        temp.r = (double)puVar11[1];
        puVar11 = (undefined8 *)((long)pvVar8 + (long)iVar10 * 0x10 + (long)iVar2 * 0x10);
        puVar12 = (undefined8 *)
                  ((long)pvVar8 + (long)(lsub._4_4_ + itemp * iVar9) * 0x10 + (long)iVar2 * 0x10);
        *puVar11 = *puVar12;
        puVar11[1] = puVar12[1];
        puVar11 = (undefined8 *)
                  ((long)pvVar8 + (long)(lsub._4_4_ + itemp * iVar9) * 0x10 + (long)iVar2 * 0x10);
        *puVar11 = lu_sup_ptr;
        puVar11[1] = temp.r;
      }
    }
    pfVar6[7] = (float)((iVar9 - lsub._4_4_) * 10) + pfVar6[7];
    z_div((doublecomplex *)&lu_sup_ptr,(doublecomplex *)&nsupc,
          (doublecomplex *)((long)pvVar8 + (long)lsub._4_4_ * 0x10 + (long)iVar3 * 0x10));
    while (lsub._4_4_ = lsub._4_4_ + 1, lsub._4_4_ < iVar9) {
      dVar13 = *(double *)((long)pvVar8 + (long)lsub._4_4_ * 0x10 + (long)iVar3 * 0x10 + 8);
      dVar1 = *(double *)((long)pvVar8 + (long)lsub._4_4_ * 0x10 + (long)iVar3 * 0x10);
      *(double *)((long)pvVar8 + (long)lsub._4_4_ * 0x10 + (long)iVar3 * 0x10) =
           *(double *)((long)pvVar8 + (long)lsub._4_4_ * 0x10 + (long)iVar3 * 0x10) *
           (double)lu_sup_ptr +
           -(*(double *)((long)pvVar8 + (long)lsub._4_4_ * 0x10 + (long)iVar3 * 0x10 + 8) * temp.r);
      *(double *)((long)pvVar8 + (long)lsub._4_4_ * 0x10 + (long)iVar3 * 0x10 + 8) =
           dVar13 * (double)lu_sup_ptr + dVar1 * temp.r;
    }
    u_local._4_4_ = 0;
  }
  else {
    *usepr = 0;
    u_local._4_4_ = jcol + 1;
  }
  return u_local._4_4_;
}

Assistant:

int
zpivotL(
        const int  jcol,     /* in */
        const double u,      /* in - diagonal pivoting threshold */
        int        *usepr,   /* re-use the pivot sequence given by perm_r/iperm_r */
        int        *perm_r,  /* may be modified */
        int        *iperm_r, /* in - inverse of perm_r */
        int        *iperm_c, /* in - used to find diagonal of Pc*A*Pc' */
        int        *pivrow,  /* out */
        GlobalLU_t *Glu,     /* modified - global LU data structures */
	SuperLUStat_t *stat  /* output */
       )
{

    doublecomplex one = {1.0, 0.0};
    int          fsupc;	    /* first column in the supernode */
    int          nsupc;	    /* no of columns in the supernode */
    int          nsupr;     /* no of rows in the supernode */
    int_t        lptr;	    /* points to the starting subscript of the supernode */
    int          pivptr, old_pivptr, diag, diagind;
    double       pivmax, rtemp, thresh;
    doublecomplex       temp;
    doublecomplex       *lu_sup_ptr; 
    doublecomplex       *lu_col_ptr;
    int_t        *lsub_ptr;
    int_t        isub, icol, k, itemp;
    int_t        *lsub, *xlsub;
    doublecomplex       *lusup;
    int_t        *xlusup;
    flops_t      *ops = stat->ops;

    /* Initialize pointers */
    lsub       = Glu->lsub;
    xlsub      = Glu->xlsub;
    lusup      = (doublecomplex *) Glu->lusup;
    xlusup     = Glu->xlusup;
    fsupc      = (Glu->xsup)[(Glu->supno)[jcol]];
    nsupc      = jcol - fsupc;	        /* excluding jcol; nsupc >= 0 */
    lptr       = xlsub[fsupc];
    nsupr      = xlsub[fsupc+1] - lptr;
    lu_sup_ptr = &lusup[xlusup[fsupc]];	/* start of the current supernode */
    lu_col_ptr = &lusup[xlusup[jcol]];	/* start of jcol in the supernode */
    lsub_ptr   = &lsub[lptr];	/* start of row indices of the supernode */

#ifdef DEBUG
if ( jcol == MIN_COL ) {
    printf("Before cdiv: col %d\n", jcol);
    for (k = nsupc; k < nsupr; k++) 
	printf("  lu[%d] %f\n", lsub_ptr[k], lu_col_ptr[k]);
}
#endif
    
    /* Determine the largest abs numerical value for partial pivoting;
       Also search for user-specified pivot, and diagonal element. */
    if ( *usepr ) *pivrow = iperm_r[jcol];
    diagind = iperm_c[jcol];
    pivmax = 0.0;
    pivptr = nsupc;
    diag = SLU_EMPTY;
    old_pivptr = nsupc;
    for (isub = nsupc; isub < nsupr; ++isub) {
        rtemp = z_abs1 (&lu_col_ptr[isub]);
	if ( rtemp > pivmax ) {
	    pivmax = rtemp;
	    pivptr = isub;
	}
	if ( *usepr && lsub_ptr[isub] == *pivrow ) old_pivptr = isub;
	if ( lsub_ptr[isub] == diagind ) diag = isub;
    }

    /* Test for singularity */
    if ( pivmax == 0.0 ) {
#if 0
        // There is no valid pivot.
        // jcol represents the rank of U, 
        // report the rank, let dgstrf handle the pivot
	*pivrow = lsub_ptr[pivptr];
	perm_r[*pivrow] = jcol;
#endif
	*usepr = 0;
	return (jcol+1);
    }

    thresh = u * pivmax;
    
    /* Choose appropriate pivotal element by our policy. */
    if ( *usepr ) {
        rtemp = z_abs1 (&lu_col_ptr[old_pivptr]);
	if ( rtemp != 0.0 && rtemp >= thresh )
	    pivptr = old_pivptr;
	else
	    *usepr = 0;
    }
    if ( *usepr == 0 ) {
	/* Use diagonal pivot? */
	if ( diag >= 0 ) { /* diagonal exists */
            rtemp = z_abs1 (&lu_col_ptr[diag]);
	    if ( rtemp != 0.0 && rtemp >= thresh ) pivptr = diag;
        }
	*pivrow = lsub_ptr[pivptr];
    }
    
    /* Record pivot row */
    perm_r[*pivrow] = jcol;
    
    /* Interchange row subscripts */
    if ( pivptr != nsupc ) {
	itemp = lsub_ptr[pivptr];
	lsub_ptr[pivptr] = lsub_ptr[nsupc];
	lsub_ptr[nsupc] = itemp;

	/* Interchange numerical values as well, for the whole snode, such 
	 * that L is indexed the same way as A.
 	 */
	for (icol = 0; icol <= nsupc; icol++) {
	    itemp = pivptr + icol * nsupr;
	    temp = lu_sup_ptr[itemp];
	    lu_sup_ptr[itemp] = lu_sup_ptr[nsupc + icol*nsupr];
	    lu_sup_ptr[nsupc + icol*nsupr] = temp;
	}
    } /* if */

    /* cdiv operation */
    ops[FACT] += 10 * (nsupr - nsupc);

    z_div(&temp, &one, &lu_col_ptr[nsupc]);
    for (k = nsupc+1; k < nsupr; k++) 
	zz_mult(&lu_col_ptr[k], &lu_col_ptr[k], &temp);

    return 0;
}